

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O2

string * __thiscall ptTy::dbgTxt_abi_cxx11_(string *__return_storage_ptr__,ptTy *this)

{
  allocator<char> local_79;
  char buf [100];
  
  snprintf(buf,100,"%7.5f, %7.5f",this->y,this->x);
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,buf,&local_79)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string ptTy::dbgTxt () const
{
    char buf[100];
    snprintf(buf, sizeof(buf), "%7.5f, %7.5f", y, x);
    return std::string(buf);
}